

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FabArray
          (FabArray<amrex::IArrayBox> *this,FabArray<amrex::IArrayBox> *rhs,MakeType maketype,
          int scomp,int ncomp)

{
  value_type pIVar1;
  uint uVar2;
  FabFactory<amrex::IArrayBox> *pFVar3;
  BoxArray *pBVar4;
  DistributionMapping *pDVar5;
  MFInfo *pMVar6;
  type __x;
  Long LVar7;
  const_reference ppIVar8;
  pointer pFVar9;
  uint in_ECX;
  int in_EDX;
  FabArrayBase *in_RSI;
  long *in_RDI;
  uint in_R8D;
  IntVect IVar10;
  IArrayBox *rhsfab;
  int n;
  int i;
  pointer in_stack_fffffffffffffee8;
  FabArrayStats *in_stack_fffffffffffffef0;
  vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *this_00;
  FabArrayBase *in_stack_ffffffffffffff00;
  long *msg;
  int local_7c;
  MFInfo local_78;
  int local_50 [3];
  undefined8 local_40;
  int local_38;
  uint local_24;
  uint local_20;
  int local_1c;
  FabArrayBase *local_18;
  char *local_8;
  
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  FabArrayBase::FabArrayBase(in_stack_ffffffffffffff00);
  *in_RDI = (long)&PTR__FabArray_01802ea0;
  pFVar3 = Factory((FabArray<amrex::IArrayBox> *)0xffbb46);
  (*pFVar3->_vptr_FabFactory[5])();
  std::
  unique_ptr<amrex::FabFactory<amrex::IArrayBox>,std::default_delete<amrex::FabFactory<amrex::IArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f));
  *(undefined1 *)(in_RDI + 0x20) = 0;
  msg = in_RDI + 0x21;
  std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::vector
            ((vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *)0xffbb9c);
  in_RDI[0x24] = 0;
  MultiArray4<int>::MultiArray4((MultiArray4<int> *)(in_RDI + 0x25));
  MultiArray4<const_int>::MultiArray4((MultiArray4<const_int> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xffbbdf);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::
  unique_ptr<amrex::FBData<amrex::IArrayBox>,std::default_delete<amrex::FBData<amrex::IArrayBox>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FBData<amrex::IArrayBox>,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
              *)in_stack_fffffffffffffef0);
  std::
  unique_ptr<amrex::PCData<amrex::IArrayBox>,std::default_delete<amrex::PCData<amrex::IArrayBox>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
              *)in_stack_fffffffffffffef0);
  std::
  unique_ptr<amrex::FabArray<amrex::IArrayBox>,std::default_delete<amrex::FabArray<amrex::IArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
              *)in_stack_fffffffffffffef0);
  FabArrayBase::FabArrayStats::recordBuild(in_stack_fffffffffffffef0);
  pBVar4 = FabArrayBase::boxArray(local_18);
  pDVar5 = FabArrayBase::DistributionMap(local_18);
  uVar2 = local_24;
  IVar10 = FabArrayBase::nGrowVect(local_18);
  local_50[2] = IVar10.vect[2];
  local_38 = local_50[2];
  local_50._0_8_ = IVar10.vect._0_8_;
  local_40._0_4_ = local_50[0];
  local_40._4_4_ = local_50[1];
  local_78.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.alloc = false;
  local_78._1_7_ = 0;
  local_78.arena = (Arena *)0x0;
  local_78.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = IVar10.vect;
  MFInfo::MFInfo((MFInfo *)0xffbcdd);
  pMVar6 = MFInfo::SetAlloc(&local_78,false);
  __x = std::
        unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
        ::operator*((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
                     *)in_stack_fffffffffffffef0);
  (**(code **)(*in_RDI + 0x18))(in_RDI,pBVar4,pDVar5,uVar2,&local_40,pMVar6);
  MFInfo::~MFInfo((MFInfo *)0xffbd40);
  if (local_1c == 0) {
    local_7c = 0;
    LVar7 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xffbd6a);
    for (; local_7c < (int)LVar7; local_7c = local_7c + 1) {
      ppIVar8 = std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::operator[]
                          ((vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *)
                           (local_18[1].boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1),
                           (long)local_7c);
      pIVar1 = *ppIVar8;
      this_00 = (vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *)(in_RDI + 0x21);
      pFVar9 = std::
               unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
               ::operator->((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
                             *)0xffbdcb);
      (*pFVar9->_vptr_FabFactory[3])(pFVar9,pIVar1,(ulong)local_20,(ulong)local_24);
      std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::push_back
                (this_00,(value_type *)__x);
    }
  }
  else {
    local_8 = "FabArray: unknown MakeType";
    Abort_host((char *)msg);
  }
  return;
}

Assistant:

FabArray<FAB>::FabArray (const FabArray<FAB>& rhs, MakeType maketype, int scomp, int ncomp)
    : m_factory(rhs.Factory().clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(rhs.boxArray(), rhs.DistributionMap(), ncomp, rhs.nGrowVect(),
           MFInfo().SetAlloc(false), *m_factory);

    if (maketype == amrex::make_alias)
    {
        for (int i = 0, n = indexArray.size(); i < n; ++i) {
            auto const& rhsfab = *(rhs.m_fabs_v[i]);
            m_fabs_v.push_back(m_factory->create_alias(rhsfab, scomp, ncomp));
        }
    }
    else
    {
        amrex::Abort("FabArray: unknown MakeType");
    }
}